

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall server_queue::cleanup_pending_task(server_queue *this,int id_target)

{
  deque<server_task,_std::allocator<server_task>_> *this_00;
  undefined4 in_ESI;
  long in_RDI;
  anon_class_4_1_e68e03d5_for__M_pred rm_func;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_1c0;
  _Deque_iterator<server_task,server_task_const&,server_task_const*> local_1a0 [8];
  const_iterator *in_stack_fffffffffffffe68;
  const_iterator *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  anon_class_4_1_e68e03d5_for__M_pred in_stack_fffffffffffffe7c;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_138;
  _Deque_iterator<server_task,server_task_const&,server_task_const*> local_118 [64];
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_d8;
  _Deque_iterator<server_task,server_task_const&,server_task_const*> local_b8 [36];
  undefined4 local_94;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_50;
  _Deque_iterator<server_task,server_task_const&,server_task_const*> local_30 [32];
  undefined4 local_10;
  
  this_00 = (deque<server_task,_std::allocator<server_task>_> *)(in_RDI + 8);
  local_10 = in_ESI;
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::begin(this_00);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::end(this_00);
  local_94 = local_10;
  std::
  remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>
            ((_Deque_iterator<server_task,_server_task_&,_server_task_*> *)in_stack_fffffffffffffe70
             ,(_Deque_iterator<server_task,_server_task_&,_server_task_*> *)
              in_stack_fffffffffffffe68,in_stack_fffffffffffffe7c);
  std::_Deque_iterator<server_task,server_task_const&,server_task_const*>::
  _Deque_iterator<std::_Deque_iterator<server_task,server_task&,server_task*>,void>
            (local_30,&local_50);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::end(this_00);
  std::_Deque_iterator<server_task,server_task_const&,server_task_const*>::
  _Deque_iterator<std::_Deque_iterator<server_task,server_task&,server_task*>,void>
            (local_b8,&local_d8);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::erase
            ((deque<server_task,_std::allocator<server_task>_> *)
             CONCAT44(in_stack_fffffffffffffe7c.id_target,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::begin(this_00);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::end(this_00);
  std::
  remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>
            ((_Deque_iterator<server_task,_server_task_&,_server_task_*> *)in_stack_fffffffffffffe70
             ,(_Deque_iterator<server_task,_server_task_&,_server_task_*> *)
              in_stack_fffffffffffffe68,in_stack_fffffffffffffe7c);
  std::_Deque_iterator<server_task,server_task_const&,server_task_const*>::
  _Deque_iterator<std::_Deque_iterator<server_task,server_task&,server_task*>,void>
            (local_118,&local_138);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::end(this_00);
  std::_Deque_iterator<server_task,server_task_const&,server_task_const*>::
  _Deque_iterator<std::_Deque_iterator<server_task,server_task&,server_task*>,void>
            (local_1a0,&local_1c0);
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::erase
            ((deque<server_task,_std::allocator<server_task>_> *)
             CONCAT44(in_stack_fffffffffffffe7c.id_target,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  return;
}

Assistant:

void cleanup_pending_task(int id_target) {
        // no need lock because this is called exclusively by post()
        auto rm_func = [id_target](const server_task & task) {
            return task.id_target == id_target;
        };
        queue_tasks.erase(
            std::remove_if(queue_tasks.begin(),          queue_tasks.end(),          rm_func),
            queue_tasks.end());
        queue_tasks_deferred.erase(
            std::remove_if(queue_tasks_deferred.begin(), queue_tasks_deferred.end(), rm_func),
            queue_tasks_deferred.end());
    }